

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

int AddByteToTrackInBits(uchar *track,uint index,uchar byte,int size,int totalSize)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uchar uVar5;
  uchar uVar6;
  
  uVar2 = (ulong)index;
  if (track == (uchar *)0x0) {
    return index + size;
  }
  if (0 < size) {
    uVar1 = (long)totalSize - 1;
    if (index != 0) {
      uVar1 = (ulong)(index - 1);
    }
    uVar5 = track[uVar1];
    iVar3 = 0;
    uVar4 = 7;
    do {
      if ((byte >> (uVar4 & 0x1f) & 1) == 0) {
        uVar1 = (ulong)((int)uVar2 + 1);
        track[uVar2] = uVar5 == '\0';
        if (iVar3 + 1 < size) {
          uVar6 = '\0';
          goto LAB_00162648;
        }
      }
      else {
        uVar1 = (ulong)((int)uVar2 + 1);
        track[uVar2] = '\0';
        uVar6 = '\x01';
        if (iVar3 + 1 < size) {
LAB_00162648:
          track[uVar1] = uVar6;
        }
      }
      uVar2 = uVar1;
      if (iVar3 + 1 < size) {
        uVar2 = (ulong)((int)uVar1 + 1);
        uVar5 = track[uVar1];
      }
      index = (uint)uVar2;
      iVar3 = iVar3 + 2;
      uVar4 = uVar4 - 1;
    } while (iVar3 < size);
  }
  return index;
}

Assistant:

int AddByteToTrackInBits(unsigned char* track, unsigned int index, unsigned char byte, int size, int totalSize)
{
   if (track == nullptr)
      return index + (size);

   unsigned char previous_bit;
   if (index > 0)
   {
      previous_bit = track[index - 1];
   }
   else
   {
      previous_bit = track[totalSize - 1];
   }

   for (int i = 0; i < size; i += 2)
   {
      // Get bit
      unsigned char c = ((byte >> (7 - (i / 2))) & 0x01);

      if (c == 1)
      {
         track[index++] = 0;
         if (i + 1 < size)
            track[index] = 1;
      }
      else
      {
         track[index++] = (previous_bit == 0) ? 1 : 0;
         if (i + 1 < size)
            track[index] = 0;
      }
      if (i + 1 < size)
         previous_bit = track[index++];
   }
   return index;
}